

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O2

ostream * testing::operator<<(ostream *os,Message *sb)

{
  ostream *poVar1;
  String local_20;
  
  Message::GetString((Message *)&local_20);
  poVar1 = internal::operator<<(os,&local_20);
  internal::String::~String(&local_20);
  return poVar1;
}

Assistant:

inline std::ostream& operator <<(std::ostream& os, const Message& sb) {
  return os << sb.GetString();
}